

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O2

void __thiscall
despot::PlannerBase::OptionParse
          (PlannerBase *this,Option *options,int *num_runs,string *world_type,string *belief_type,
          int *time_limit,string *solver_type,bool *search_solver)

{
  int iVar1;
  double dVar2;
  
  if (options[0x19].desc != (Descriptor *)0x0) {
    DAT_0019fe20 = 1;
  }
  if (options[4].desc != (Descriptor *)0x0) {
    DAT_0019fdd0 = atoi(options[4].arg);
  }
  if (options[5].desc != (Descriptor *)0x0) {
    DAT_0019fdd8 = atof(options[5].arg);
  }
  if (options[8].desc == (Descriptor *)0x0) {
    dVar2 = get_time_second();
    DAT_0019fdf0 = (int)(((long)dVar2 * 1000) % 1000000000);
  }
  else {
    DAT_0019fdf0 = atoi(options[8].arg);
  }
  if (options[9].desc != (Descriptor *)0x0) {
    Globals::config = atof(options[9].arg);
  }
  if (options[10].desc != (Descriptor *)0x0) {
    DAT_0019fdcc = atoi(options[10].arg);
  }
  if (options[0xb].desc != (Descriptor *)0x0) {
    DAT_0019fde0 = atof(options[0xb].arg);
  }
  if (options[0xc].desc != (Descriptor *)0x0) {
    DAT_0019fde8 = atof(options[0xc].arg);
  }
  if (options[0xd].desc != (Descriptor *)0x0) {
    DAT_0019fdc8 = atoi(options[0xd].arg);
  }
  if (options[0xe].desc != (Descriptor *)0x0) {
    std::__cxx11::string::assign((char *)world_type);
  }
  if (options[0xf].desc != (Descriptor *)0x0) {
    DAT_0019fdd4 = atoi(options[0xf].arg);
  }
  if (options[0x10].desc != (Descriptor *)0x0) {
    std::__cxx11::string::assign(&DAT_0019fdf8);
  }
  if (options[0x11].desc != (Descriptor *)0x0) {
    iVar1 = atoi(options[0x11].arg);
    *num_runs = iVar1;
  }
  if (options[0x16].desc != (Descriptor *)0x0) {
    std::__cxx11::string::assign((char *)belief_type);
  }
  if (options[0x1b].desc != (Descriptor *)0x0) {
    iVar1 = atoi(options[0x1b].arg);
    *time_limit = iVar1;
  }
  if (options[0x1c].desc != (Descriptor *)0x0) {
    DAT_0019fe18 = atof(options[0x1c].arg);
  }
  *search_solver = options[0x1d].desc != (Descriptor *)0x0;
  if (options[0x1a].desc != (Descriptor *)0x0) {
    std::__cxx11::string::assign((char *)solver_type);
  }
  if (options[0x18].desc == (Descriptor *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = atoi(options[0x18].arg);
  }
  logging::level(iVar1);
  return;
}

Assistant:

void PlannerBase::OptionParse(option::Option *options, int &num_runs,
		string &world_type, string &belief_type, int &time_limit,
		string &solver_type, bool &search_solver) {
	if (options[E_SILENCE])
		Globals::config.silence = true;

	if (options[E_DEPTH])
		Globals::config.search_depth = atoi(options[E_DEPTH].arg);

	if (options[E_DISCOUNT])
		Globals::config.discount = atof(options[E_DISCOUNT].arg);

	if (options[E_SEED])
		Globals::config.root_seed = atoi(options[E_SEED].arg);
	else { // last 9 digits of current time in milli second
		long millis = (long) get_time_second() * 1000;
		long range = (long) pow((double) 10, (int) 9);
		Globals::config.root_seed = (unsigned int) (millis
				- (millis / range) * range);
	}

	if (options[E_TIMEOUT])
		Globals::config.time_per_move = atof(options[E_TIMEOUT].arg);

	if (options[E_NUMPARTICLES])
		Globals::config.num_scenarios = atoi(options[E_NUMPARTICLES].arg);

	if (options[E_PRUNE])
		Globals::config.pruning_constant = atof(options[E_PRUNE].arg);

	if (options[E_GAP])
		Globals::config.xi = atof(options[E_GAP].arg);

	if (options[E_SIM_LEN])
		Globals::config.sim_len = atoi(options[E_SIM_LEN].arg);

	if (options[E_WORLD])
		world_type = options[E_WORLD].arg;

	if (options[E_MAX_POLICY_SIM_LEN])
		Globals::config.max_policy_sim_len = atoi(
				options[E_MAX_POLICY_SIM_LEN].arg);

	if (options[E_DEFAULT_ACTION])
		Globals::config.default_action = options[E_DEFAULT_ACTION].arg;

	if (options[E_RUNS])
		num_runs = atoi(options[E_RUNS].arg);

	if (options[E_BELIEF])
		belief_type = options[E_BELIEF].arg;

	if (options[E_TIME_LIMIT])
		time_limit = atoi(options[E_TIME_LIMIT].arg);

	if (options[E_NOISE])
		Globals::config.noise = atof(options[E_NOISE].arg);

	search_solver = options[E_SEARCH_SOLVER];

	if (options[E_SOLVER])
		solver_type = options[E_SOLVER].arg;

	int verbosity = 0;
	if (options[E_VERBOSITY])
		verbosity = atoi(options[E_VERBOSITY].arg);
	logging::level(verbosity);
}